

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O3

void rename_var(VarId *id,BasicBlock *b,
               map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
               *nodes,map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *dom_tree)

{
  uint32_t *__v;
  _Rb_tree_header *p_Var1;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__v_00;
  __index_type _Var2;
  _Rb_tree_color _Var3;
  element_type *peVar4;
  element_type *peVar5;
  BasicBlock *b_00;
  int iVar6;
  uint32_t uVar7;
  pointer pvVar8;
  variant_alternative_t<0UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar9;
  variant_alternative_t<1UL,_variant<shared_ptr<Inst>,_shared_ptr<JumpInstruction>,_shared_ptr<JumpLabelId>_>_>
  *pvVar10;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar11;
  variant_alternative_t<0UL,_variant<VarId,_basic_string<char>_>_> *pvVar12;
  ulong uVar13;
  pointer ppBVar14;
  _Base_ptr p_Var15;
  pointer ppBVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  long lVar19;
  _Base_ptr p_Var20;
  _func_int **pp_Var21;
  ulong uVar22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var23;
  long lVar24;
  ulong uVar25;
  VarId xv;
  VarId local_1b8;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  *local_1a8;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *local_1a0;
  uint32_t local_194;
  BasicBlock *local_190;
  _Base_ptr local_188;
  VarId local_180;
  VarId local_170;
  undefined **local_160;
  uint32_t local_158;
  VarId local_150;
  undefined **local_140;
  uint32_t local_138;
  VarId local_130;
  undefined **local_120;
  uint32_t local_118;
  VarId local_110;
  undefined **local_100;
  uint32_t local_f8;
  VarId local_f0;
  undefined **local_e0;
  uint32_t local_d8;
  VarId local_d0;
  undefined **local_c0;
  uint32_t local_b8;
  VarId local_b0;
  undefined **local_a0;
  uint32_t local_98;
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
  local_60;
  
  local_194 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].id;
  pvVar8 = (b->inst).
           super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = &nodes->_M_t;
  local_1a0 = &dom_tree->_M_t;
  local_190 = b;
  if ((b->inst).
      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar8) {
    uVar22 = 0;
    do {
      __v_00 = pvVar8 + uVar22;
      _Var2 = (__v_00->
              super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ).
              super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              .
              super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
              ._M_index;
      if (_Var2 == '\x01') {
        pvVar10 = std::
                  get<1ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                            (__v_00);
        peVar5 = (pvVar10->
                 super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var23 = (pvVar10->
                  super___shared_ptr<mir::inst::JumpInstruction,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
          }
        }
        if (((peVar5->kind - Return < 2) &&
            ((peVar5->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
             super__Optional_payload_base<mir::inst::VarId>._M_engaged == true)) &&
           ((peVar5->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
            super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id == id->id)) {
          (peVar5->cond_or_ret).super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
          super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id =
               V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].id;
        }
LAB_00192964:
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00192fbc:
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
        }
      }
      else if (_Var2 == '\0') {
        pvVar9 = std::
                 get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                           (__v_00);
        peVar4 = (pvVar9->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        p_Var23 = (pvVar9->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
          }
        }
        iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
        if (iVar6 == 0) {
          if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
            }
          }
          if (*(char *)&peVar4[2].super_Displayable._vptr_Displayable == '\x01') {
            pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
            if (pvVar11->id == id->id) {
              uVar7 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].id;
              peVar4[1].dest.super_Displayable._vptr_Displayable =
                   (_func_int **)&PTR_display_001eb100;
              peVar4[1].dest.id = uVar7;
              *(undefined1 *)&peVar4[2].super_Displayable._vptr_Displayable = 1;
              std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
            }
          }
          uVar7 = (peVar4->dest).id;
          if (uVar7 == id->id) {
            local_a0 = &PTR_display_001eb100;
            local_98 = uVar7;
            rename((char *)&local_1b8,(char *)&local_a0);
            (peVar4->dest).id = local_1b8.id;
            local_b0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
            local_b0.id = local_1b8.id;
            push(&local_b0);
          }
        }
        else {
          iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
          if (iVar6 == 6) {
            if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
              }
            }
            pp_Var21 = peVar4[2].dest.super_Displayable._vptr_Displayable;
            if (*(_func_int ***)&peVar4[2].dest.id != pp_Var21) {
              lVar19 = 8;
              lVar24 = 0x18;
              uVar25 = 0;
              do {
                if (*(char *)((long)pp_Var21 + lVar24) == '\x01') {
                  pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)((long)pp_Var21 + lVar19));
                  pp_Var21 = peVar4[2].dest.super_Displayable._vptr_Displayable;
                  if (pvVar11->id == id->id) {
                    uVar7 = V.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].id;
                    *(undefined ***)((long)pp_Var21 + lVar19) = &PTR_display_001eb100;
                    *(uint32_t *)((long)pp_Var21 + lVar19 + 8) = uVar7;
                    *(undefined1 *)((long)pp_Var21 + lVar19 + 0x10) = 1;
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)((long)pp_Var21 + lVar19));
                    pp_Var21 = peVar4[2].dest.super_Displayable._vptr_Displayable;
                  }
                }
                uVar25 = uVar25 + 1;
                lVar19 = lVar19 + 0x20;
                lVar24 = lVar24 + 0x20;
              } while (uVar25 < (ulong)(*(long *)&peVar4[2].dest.id - (long)pp_Var21 >> 5));
            }
            b = local_190;
            uVar7 = (peVar4->dest).id;
            if (uVar7 == id->id) {
              local_c0 = &PTR_display_001eb100;
              local_b8 = uVar7;
              rename((char *)&local_1b8,(char *)&local_c0);
              (peVar4->dest).id = local_1b8.id;
              local_d0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              local_d0.id = local_1b8.id;
              push(&local_d0);
            }
          }
          else {
            iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
            if (iVar6 == 1) {
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                }
              }
              if (*(char *)&peVar4[2].super_Displayable._vptr_Displayable == '\x01') {
                pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                    ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                if (pvVar11->id == id->id) {
                  uVar7 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  peVar4[1].dest.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  peVar4[1].dest.id = uVar7;
                  *(undefined1 *)&peVar4[2].super_Displayable._vptr_Displayable = 1;
                  std::get<1ul,int,mir::inst::VarId>
                            ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                }
              }
              if (*(char *)&peVar4[3].dest.super_Displayable._vptr_Displayable == '\x01') {
                __v = &peVar4[2].dest.id;
                pvVar11 = std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
                if (pvVar11->id == id->id) {
                  uVar7 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                          _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  *(undefined ***)&peVar4[2].dest.id = &PTR_display_001eb100;
                  *(uint32_t *)&peVar4[3].super_Displayable._vptr_Displayable = uVar7;
                  *(undefined1 *)&peVar4[3].dest.super_Displayable._vptr_Displayable = 1;
                  std::get<1ul,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)__v);
                }
              }
              uVar7 = (peVar4->dest).id;
              if (uVar7 == id->id) {
                local_e0 = &PTR_display_001eb100;
                local_d8 = uVar7;
                rename((char *)&local_1b8,(char *)&local_e0);
                (peVar4->dest).id = local_1b8.id;
                local_f0.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_f0.id = local_1b8.id;
                push(&local_f0);
              }
            }
            else {
              iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
              if (iVar6 == 3) {
                if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                    UNLOCK();
                  }
                  else {
                    p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                  }
                }
                if (*(char *)&peVar4[2].super_Displayable._vptr_Displayable == '\x01') {
                  pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                      ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                  if (pvVar11->id == id->id) {
                    uVar7 = V.
                            super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                            _M_impl.super__Vector_impl_data._M_finish[-1].id;
                    peVar4[1].dest.super_Displayable._vptr_Displayable =
                         (_func_int **)&PTR_display_001eb100;
                    peVar4[1].dest.id = uVar7;
                    *(undefined1 *)&peVar4[2].super_Displayable._vptr_Displayable = 1;
                    std::get<1ul,int,mir::inst::VarId>
                              ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                  }
                }
                uVar7 = (peVar4->dest).id;
                if (uVar7 == id->id) {
                  local_100 = &PTR_display_001eb100;
                  local_f8 = uVar7;
                  rename((char *)&local_1b8,(char *)&local_100);
                  (peVar4->dest).id = local_1b8.id;
                  local_110.super_Displayable._vptr_Displayable =
                       (_func_int **)&PTR_display_001eb100;
                  local_110.id = local_1b8.id;
                  push(&local_110);
                }
              }
              else {
                iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
                if (iVar6 == 4) {
                  if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    if (__libc_single_threaded == '\0') {
                      LOCK();
                      p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                      UNLOCK();
                    }
                    else {
                      p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                    }
                  }
                  if (*(char *)&peVar4[2].super_Displayable._vptr_Displayable == '\x01') {
                    pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                        ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                    if (pvVar11->id == id->id) {
                      uVar7 = V.
                              super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                              ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                      peVar4[1].dest.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001eb100;
                      peVar4[1].dest.id = uVar7;
                      *(undefined1 *)&peVar4[2].super_Displayable._vptr_Displayable = 1;
                      std::get<1ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&peVar4[1].dest);
                    }
                  }
                  if ((peVar4->dest).id == id->id) {
                    (peVar4->dest).id =
                         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>.
                         _M_impl.super__Vector_impl_data._M_finish[-1].id;
                  }
                }
                else {
                  iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
                  if (iVar6 == 5) {
                    if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                      if (__libc_single_threaded == '\0') {
                        LOCK();
                        p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                        UNLOCK();
                      }
                      else {
                        p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                      }
                    }
                    if ((char)peVar4[2].dest.id == '\x01') {
                      pvVar11 = std::get<1ul,int,mir::inst::VarId>
                                          ((variant<int,_mir::inst::VarId> *)(peVar4 + 2));
                      if (pvVar11->id == id->id) {
                        uVar7 = V.
                                super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                        peVar4[2].super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        *(uint32_t *)&peVar4[2].dest.super_Displayable._vptr_Displayable = uVar7;
                        *(undefined1 *)&peVar4[2].dest.id = 1;
                        std::get<1ul,int,mir::inst::VarId>
                                  ((variant<int,_mir::inst::VarId> *)(peVar4 + 2));
                      }
                    }
                    uVar7 = id->id;
                    if (*(uint32_t *)&peVar4[1].dest.super_Displayable._vptr_Displayable == uVar7) {
                      *(uint32_t *)&peVar4[1].dest.super_Displayable._vptr_Displayable =
                           V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                      uVar7 = id->id;
                    }
                    if ((peVar4->dest).id == uVar7) {
                      local_120 = &PTR_display_001eb100;
                      local_118 = uVar7;
                      rename((char *)&local_1b8,(char *)&local_120);
                      (peVar4->dest).id = local_1b8.id;
                      local_130.super_Displayable._vptr_Displayable =
                           (_func_int **)&PTR_display_001eb100;
                      local_130.id = local_1b8.id;
                      push(&local_130);
                    }
                  }
                  else {
                    iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
                    if (iVar6 == 2) {
                      if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                        }
                      }
                      if (*(char *)&peVar4[2].dest.super_Displayable._vptr_Displayable == '\0') {
                        pvVar12 = std::get<0ul,mir::inst::VarId,std::__cxx11::string>
                                            ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                              *)(peVar4 + 1));
                        if (pvVar12->id == id->id) {
                          local_1b8.super_Displayable._vptr_Displayable =
                               (_func_int **)&PTR_display_001eb100;
                          local_1b8.id = V.
                                         super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                                         ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                          std::variant<mir::inst::VarId,std::__cxx11::string>::
                          emplace<0ul,mir::inst::VarId>
                                    ((variant<mir::inst::VarId,std::__cxx11::string> *)(peVar4 + 1),
                                     &local_1b8);
                        }
                      }
                      uVar7 = (peVar4->dest).id;
                      if (uVar7 == id->id) {
                        local_140 = &PTR_display_001eb100;
                        local_138 = uVar7;
                        rename((char *)&local_1b8,(char *)&local_140);
                        (peVar4->dest).id = local_1b8.id;
                        local_150.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        local_150.id = local_1b8.id;
                        push(&local_150);
                      }
                    }
                    else {
                      iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
                      if (iVar6 != 7) goto LAB_00192964;
                      if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                        if (__libc_single_threaded == '\0') {
                          LOCK();
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                          UNLOCK();
                        }
                        else {
                          p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                        }
                      }
                      uVar7 = (peVar4->dest).id;
                      if (uVar7 == id->id) {
                        local_160 = &PTR_display_001eb100;
                        local_158 = uVar7;
                        rename((char *)&local_1b8,(char *)&local_160);
                        (peVar4->dest).id = local_1b8.id;
                        local_170.super_Displayable._vptr_Displayable =
                             (_func_int **)&PTR_display_001eb100;
                        local_170.id = local_1b8.id;
                        push(&local_170);
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
          goto LAB_00192fbc;
        }
      }
      uVar22 = uVar22 + 1;
      pvVar8 = (b->inst).
               super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar25 = ((long)(b->inst).
                      super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
               -0x5555555555555555;
    } while (uVar22 <= uVar25 && uVar25 - uVar22 != 0);
  }
  ppBVar14 = (b->nextBlock).
             super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  ppBVar16 = (b->nextBlock).
             super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar16 != ppBVar14) {
    p_Var15 = &(((_Rep_type *)&local_1a8->_M_impl)->_M_impl).super__Rb_tree_header._M_header;
    uVar22 = 0;
    local_188 = p_Var15;
    do {
      p_Var20 = (((_Rep_type *)&local_1a8->_M_impl)->_M_impl).super__Rb_tree_header._M_header.
                _M_parent;
      p_Var18 = p_Var15;
      if (p_Var20 != (_Base_ptr)0x0) {
        iVar6 = ppBVar14[uVar22]->id;
        p_Var17 = p_Var15;
        do {
          if (iVar6 <= (int)p_Var20[1]._M_color) {
            p_Var17 = p_Var20;
          }
          p_Var20 = (&p_Var20->_M_left)[(int)p_Var20[1]._M_color < iVar6];
        } while (p_Var20 != (_Base_ptr)0x0);
        if ((p_Var17 != p_Var15) && (p_Var18 = p_Var17, iVar6 < (int)p_Var17[1]._M_color)) {
          p_Var18 = p_Var15;
        }
      }
      p_Var20 = p_Var18[1]._M_parent;
      p_Var18 = p_Var20->_M_parent;
      if (p_Var20->_M_left != p_Var18) {
        lVar19 = 0;
        uVar25 = 0;
        do {
          if (*(char *)((long)&p_Var18->_M_left + lVar19) == '\0') {
            pvVar9 = std::
                     get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                               ((variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                 *)((long)&p_Var18->_M_color + lVar19));
            peVar4 = (pvVar9->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            p_Var23 = (pvVar9->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>).
                      _M_refcount._M_pi;
            if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
              }
            }
            iVar6 = (*(peVar4->super_Displayable)._vptr_Displayable[1])(peVar4);
            if (iVar6 == 7) {
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var23->_M_use_count = p_Var23->_M_use_count + 1;
                }
              }
              if (*(uint32_t *)&peVar4[1].dest.super_Displayable._vptr_Displayable == id->id) {
                local_1b8.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
                local_1b8.id = V.
                               super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>
                               ._M_impl.super__Vector_impl_data._M_finish[-1].id;
                std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
                emplace_back<mir::inst::VarId>
                          ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                           &peVar4[1].dest.id,&local_1b8);
              }
              if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
LAB_00193114:
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var23);
              }
            }
            else if (p_Var23 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
            goto LAB_00193114;
          }
          uVar25 = uVar25 + 1;
          p_Var18 = p_Var20->_M_parent;
          uVar13 = ((long)p_Var20->_M_left - (long)p_Var18 >> 3) * -0x5555555555555555;
          lVar19 = lVar19 + 0x18;
        } while (uVar25 <= uVar13 && uVar13 - uVar25 != 0);
        ppBVar14 = (local_190->nextBlock).
                   super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppBVar16 = (local_190->nextBlock).
                   super__Vector_base<front::optim_mir::BasicBlock_*,_std::allocator<front::optim_mir::BasicBlock_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        p_Var15 = local_188;
        b = local_190;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < (ulong)((long)ppBVar16 - (long)ppBVar14 >> 3));
  }
  p_Var15 = (((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header._M_header._M_parent;
  if (p_Var15 != (_Base_ptr)0x0) {
    p_Var1 = &(((_Rep_type *)&local_1a0->_M_impl)->_M_impl).super__Rb_tree_header;
    iVar6 = b->id;
    p_Var20 = &p_Var1->_M_header;
    do {
      if (iVar6 <= (int)p_Var15[1]._M_color) {
        p_Var20 = p_Var15;
      }
      p_Var15 = (&p_Var15->_M_left)[(int)p_Var15[1]._M_color < iVar6];
    } while (p_Var15 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var20 != p_Var1) && ((int)p_Var20[1]._M_color <= iVar6)) &&
       (p_Var15 = p_Var20[1]._M_parent, p_Var20[1]._M_left != p_Var15)) {
      p_Var1 = &(((_Rep_type *)&local_1a8->_M_impl)->_M_impl).super__Rb_tree_header;
      uVar22 = 0;
      do {
        p_Var18 = (local_1a8->_M_impl).super__Rb_tree_header._M_header._M_parent;
        p_Var17 = &p_Var1->_M_header;
        if (p_Var18 != (_Base_ptr)0x0) {
          _Var3 = (&p_Var15->_M_color)[uVar22];
          p_Var15 = &p_Var1->_M_header;
          do {
            if ((int)_Var3 <= (int)p_Var18[1]._M_color) {
              p_Var15 = p_Var18;
            }
            p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < (int)_Var3];
          } while (p_Var18 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var15 != p_Var1) &&
             (p_Var17 = p_Var15, (int)_Var3 < (int)p_Var15[1]._M_color)) {
            p_Var17 = &p_Var1->_M_header;
          }
        }
        local_180.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_180.id = id->id;
        b_00 = (BasicBlock *)p_Var17[1]._M_parent;
        std::
        _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
        ::_Rb_tree(&local_60,local_1a8);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::_Rb_tree(&local_90,local_1a0);
        rename_var(&local_180,b_00,
                   (map<int,_front::optim_mir::BasicBlock_*,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
                    *)&local_60,
                   (map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                    *)&local_90);
        std::
        _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<int,_std::pair<const_int,_front::optim_mir::BasicBlock_*>,_std::_Select1st<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_front::optim_mir::BasicBlock_*>_>_>
        ::~_Rb_tree(&local_60);
        uVar22 = uVar22 + 1;
        p_Var15 = p_Var20[1]._M_parent;
      } while (uVar22 < (ulong)((long)p_Var20[1]._M_left - (long)p_Var15 >> 2));
    }
  }
  uVar7 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].id;
  while (uVar7 != local_194) {
    uVar7 = V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
            super__Vector_impl_data._M_finish[-2].id;
    V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
    super__Vector_impl_data._M_finish =
         V.super__Vector_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
  }
  return;
}

Assistant:

void rename_var(mir::inst::VarId id, BasicBlock* b, map<int, BasicBlock*> nodes,
                map<int, vector<int>> dom_tree) {
  mir::inst::VarId ve = top();
  for (int i = 0; i < b->inst.size(); i++) {
    if (b->inst[i].index() == 0) {
      shared_ptr<mir::inst::Inst> ins = get<0>(b->inst[i]);
      if (ins->inst_kind() == mir::inst::InstKind::Assign) {
        shared_ptr<mir::inst::AssignInst> in =
            static_pointer_cast<mir::inst::AssignInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Call) {
        shared_ptr<mir::inst::CallInst> in =
            static_pointer_cast<mir::inst::CallInst>(ins);
        for (int k = 0; k < in->params.size(); k++) {
          if (in->params[k].index() == 1) {
            mir::inst::VarId x = get<1>(in->params[k]);
            if (x == id) {
              in->params[k].emplace<1>(top());
            }
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Op) {
        shared_ptr<mir::inst::OpInst> in =
            static_pointer_cast<mir::inst::OpInst>(ins);
        if (in->lhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->lhs);
          if (x == id) {
            in->lhs.emplace<1>(top());
          }
        }
        if (in->rhs.index() == 1) {
          mir::inst::VarId x = get<1>(in->rhs);
          if (x == id) {
            in->rhs.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Load) {
        shared_ptr<mir::inst::LoadInst> in =
            static_pointer_cast<mir::inst::LoadInst>(ins);
        if (in->src.index() == 1) {
          mir::inst::VarId x = get<1>(in->src);
          if (x == id) {
            in->src.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Store) {
        shared_ptr<mir::inst::StoreInst> in =
            static_pointer_cast<mir::inst::StoreInst>(ins);
        if (in->val.index() == 1) {
          mir::inst::VarId x = get<1>(in->val);
          if (x == id) {
            in->val.emplace<1>(top());
          }
        }
        if (in->dest == id) {
          in->dest = top();
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::PtrOffset) {
        shared_ptr<mir::inst::PtrOffsetInst> in =
            static_pointer_cast<mir::inst::PtrOffsetInst>(ins);
        if (in->offset.index() == 1) {
          mir::inst::VarId x = get<1>(in->offset);
          if (x == id) {
            in->offset.emplace<1>(top());
          }
        }
        if (in->ptr == id) {
          in->ptr = top();
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Ref) {
        shared_ptr<mir::inst::RefInst> in =
            static_pointer_cast<mir::inst::RefInst>(ins);
        if (in->val.index() == 0) {
          mir::inst::VarId x = get<0>(in->val);
          if (x == id) {
            in->val.emplace<0>(top());
          }
        }
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else if (ins->inst_kind() == mir::inst::InstKind::Phi) {
        shared_ptr<mir::inst::PhiInst> in =
            static_pointer_cast<mir::inst::PhiInst>(ins);
        if (in->dest == id) {
          mir::inst::VarId xv = rename(id);
          in->dest = xv;
          push(xv);
        }
      } else {
        // nothing
      }
    } else if (b->inst[i].index() == 1) {
      shared_ptr<mir::inst::JumpInstruction> ins = get<1>(b->inst[i]);
      if (ins->kind == mir::inst::JumpInstructionKind::BrCond ||
          ins->kind == mir::inst::JumpInstructionKind::Return) {
        if (ins->cond_or_ret && ins->cond_or_ret == id) {
          ins->cond_or_ret = top();
        }
      }
    }
  }
  for (int j = 0; j < b->nextBlock.size(); j++) {
    map<int, BasicBlock*>::iterator iter = nodes.find(b->nextBlock[j]->id);
    BasicBlock* bb = iter->second;
    for (int i = 0; i < bb->inst.size(); i++) {
      if (bb->inst[i].index() == 0) {
        shared_ptr<mir::inst::Inst> ins = get<0>(bb->inst[i]);
        if (ins->inst_kind() == mir::inst::InstKind::Phi) {
          shared_ptr<mir::inst::PhiInst> in =
              static_pointer_cast<mir::inst::PhiInst>(ins);
          if (in->ori_var == id) {
            in->vars.push_back(top());
          }
        }
      }
    }
  }
  map<int, vector<int>>::iterator dtr = dom_tree.find(b->id);
  if (dtr != dom_tree.end()) {
    for (int i = 0; i < dtr->second.size(); i++) {
      map<int, BasicBlock*>::iterator it = nodes.find(dtr->second[i]);
      rename_var(id, it->second, nodes, dom_tree);
    }
  }
  while (top() != ve) {
    pop();
  }
}